

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

void parse_query_params(CVmObjLookupTable *tab,char *p,int encmode)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  vm_val_t key;
  vm_val_t local_40;
  
  if (*p != '\0') {
    do {
      pcVar1 = strchr(p,0x26);
      if (pcVar1 == (char *)0x0) {
        sVar2 = strlen(p);
        pcVar1 = p + sVar2;
      }
      pcVar3 = strchr(p,0x3d);
      pcVar4 = pcVar3;
      if (pcVar1 < pcVar3) {
        pcVar4 = pcVar1;
      }
      if (pcVar3 == (char *)0x0) {
        pcVar4 = pcVar1;
      }
      pcVar3 = pcVar1 + ~(ulong)pcVar4;
      if (pcVar4 == pcVar1) {
        pcVar3 = (char *)0x0;
      }
      new_parsed_str(&local_40,p,(long)pcVar4 - (long)p,encmode);
      add_parsed_val(tab,&local_40,pcVar4 + 1,(size_t)pcVar3,encmode);
      p = pcVar1 + (*pcVar1 != '\0');
    } while (*p != '\0');
  }
  return;
}

Assistant:

static void parse_query_params(VMG_ CVmObjLookupTable *tab, const char *p,
                               int encmode)
{
    /* parse the arguments */
    while (*p != '\0')
    {
        /* the end of this argument is at the next '&' */
        const char *amp = strchr(p, '&');
        if (amp == 0)
            amp = p + strlen(p);

        /* find the '=', if any */
        const char *eq = strchr(p, '=');
        if (eq == 0 || eq > amp)
            eq = amp;

        /* add the resource name under the name key */
        add_parsed_val(vmg_ tab, p, eq - p,
                       eq + 1, eq == amp ? 0 : amp - eq - 1, encmode);

        /* move on to the next delimiter */
        p = amp;
        if (*p != '\0')
            ++p;
    }
}